

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQuery
          (ClientContext *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,case_insensitive_map_t<BoundParameterData> *values,bool allow_stream_result)

{
  pointer pSVar1;
  type pCVar2;
  undefined7 in_register_00000009;
  pointer *__ptr;
  undefined1 local_d8 [8];
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  string query;
  undefined8 local_a8 [16];
  
  make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)&lock,(mutex *)(statement + 0x48));
  pSVar1 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)values);
  ::std::__cxx11::string::string((string *)&query,(string *)&pSVar1->query);
  pCVar2 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*(&lock);
  InitialCleanup((ClientContext *)statement,pCVar2);
  local_a8[0] = CONCAT71(in_register_00000009,allow_stream_result);
  pCVar2 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*(&lock);
  local_d8 = (undefined1  [8])(values->_M_h)._M_buckets;
  (values->_M_h)._M_buckets = (__buckets_ptr)0x0;
  PendingQueryInternal
            (this,(ClientContextLock *)statement,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             pCVar2,(PendingQueryParameters *)local_d8,SUB81(local_a8,0));
  if (local_d8 != (undefined1  [8])0x0) {
    (*(code *)((__node_base_ptr)((_Hashtable *)local_d8)->_M_buckets)[1]._M_nxt)();
  }
  local_d8 = (undefined1  [8])0x0;
  ::std::__cxx11::string::~string((string *)&query);
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr(&lock.
               super_unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
             );
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQuery(unique_ptr<SQLStatement> statement,
                                                           case_insensitive_map_t<BoundParameterData> &values,
                                                           bool allow_stream_result) {
	auto lock = LockContext();
	auto query = statement->query;
	try {
		InitialCleanup(*lock);

		PendingQueryParameters params;
		params.allow_stream_result = allow_stream_result;
		params.parameters = values;

		return PendingQueryInternal(*lock, std::move(statement), params, true);
	} catch (std::exception &ex) {
		return make_uniq<PendingQueryResult>(ErrorData(ex));
	}
}